

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int CMinternal_listen(CManager_conflict cm,attr_list listen_info,int try_others)

{
  FILE *pFVar1;
  atom_t aVar2;
  long lVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  attr_list p_Var7;
  pthread_t pVar8;
  attr_list p_Var9;
  char *pcVar10;
  attr_list *pp_Var11;
  transport_entry p_Var12;
  transport_entry_conflict *pp_Var13;
  long lVar14;
  char *chosen_transport;
  char *iface;
  timespec ts;
  char *local_50;
  char *local_48;
  timespec local_40;
  
  p_Var7 = (attr_list)0x0;
  local_50 = (char *)0x0;
  local_48 = (char *)0x0;
  if (listen_info != (attr_list)0x0) {
    p_Var7 = (attr_list)attr_copy_list(listen_info);
    p_Var7 = split_transport_attributes(p_Var7);
    get_string_attr(p_Var7,CM_TRANSPORT,&local_50);
    get_string_attr(p_Var7,CM_IP_INTERFACE,&local_48);
  }
  if (local_50 != (char *)0x0) {
    iVar4 = CMtrace_val[2];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,CMConnectionVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar8 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CM - Listening only on transport \"%s\"\n",local_50);
    }
    fflush((FILE *)cm->CMTrace_file);
    iVar4 = load_transport(cm,local_50,1);
    if (iVar4 == 0) {
      iVar4 = CMtrace_val[2];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMConnectionVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                local_50);
      }
      fflush((FILE *)cm->CMTrace_file);
      iVar4 = CMtrace_val[5];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMTransportVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                local_50);
      }
      fflush((FILE *)cm->CMTrace_file);
      if (try_others == 0) {
        iVar4 = 0;
        goto LAB_001182c6;
      }
      local_50 = (char *)0x0;
    }
  }
  pp_Var13 = cm->transports;
  iVar4 = 0;
  if ((pp_Var13 != (transport_entry_conflict *)0x0) &&
     (p_Var12 = *pp_Var13, iVar4 = 0, p_Var12 != (transport_entry)0x0)) {
    iVar4 = 0;
    do {
      if ((local_50 == (char *)0x0) || (iVar6 = strcmp(p_Var12->trans_name,local_50), iVar6 == 0)) {
        p_Var9 = (*p_Var12->listen)(cm,&CMstatic_trans_svcs,p_Var12,p_Var7);
        add_attr(p_Var9,CM_CMANAGER_ID,1,(long)cm->CManager_ID);
        aVar2 = CM_IP_INTERFACE;
        if (local_48 != (char *)0x0) {
          pcVar10 = strdup(local_48);
          add_string_attr(p_Var9,aVar2,pcVar10);
        }
        pp_Var11 = cm->contact_lists;
        if (pp_Var11 == (attr_list *)0x0) {
          pp_Var11 = (attr_list *)INT_CMmalloc(0x10);
          lVar14 = 0;
        }
        else {
          lVar3 = 0;
          do {
            lVar14 = lVar3;
            lVar3 = lVar14 + 1;
          } while (pp_Var11[lVar14] != (attr_list)0x0);
          pp_Var11 = (attr_list *)INT_CMrealloc(pp_Var11,lVar14 * 8 + 0x10U & 0x7fffffff8);
        }
        cm->contact_lists = pp_Var11;
        pp_Var11[lVar14] = p_Var9;
        cm->contact_lists[lVar14 + 1] = (attr_list)0x0;
        iVar6 = CMtrace_val[2];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar6 = CMtrace_init(cm,CMConnectionVerbose);
        }
        if (iVar6 != 0) {
          fwrite("Adding contact list -> ",0x17,1,(FILE *)cm->CMTrace_file);
          fdump_attr_list(cm->CMTrace_file,p_Var9);
        }
        iVar4 = (iVar4 + 1) - (uint)(p_Var9 == (attr_list)0x0);
      }
      p_Var12 = pp_Var13[1];
      pp_Var13 = pp_Var13 + 1;
    } while (p_Var12 != (transport_entry)0x0);
  }
LAB_001182c6:
  if (p_Var7 != (attr_list)0x0) {
    free_attr_list(p_Var7);
  }
  return iVar4;
}

Assistant:

extern int
CMinternal_listen(CManager cm, attr_list listen_info, int try_others)
{
    int success = 0;
    transport_entry *trans_list;
    char *chosen_transport = NULL;
    char *iface = NULL;

    if (listen_info) {
        listen_info = split_transport_attributes(attr_copy_list(listen_info));
	get_string_attr(listen_info, CM_TRANSPORT, &chosen_transport);
	get_string_attr(listen_info, CM_IP_INTERFACE, &iface);
    }
    if (chosen_transport != NULL) {
        CMtrace_out(cm, CMConnectionVerbose,
		    "CM - Listening only on transport \"%s\"\n",
		    chosen_transport);
	if (load_transport(cm, chosen_transport, 1) == 0) {
	    CMtrace_out(cm, CMConnectionVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
					chosen_transport);
	    CMtrace_out(cm, CMTransportVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
			chosen_transport);
	    if (!try_others) {
		if (listen_info) free_attr_list(listen_info);
		return success;
	    }
	    chosen_transport = NULL;
	}
    }
    trans_list = cm->transports;
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	attr_list attrs;
	if ((chosen_transport == NULL) || 
	    (strcmp((*trans_list)->trans_name, chosen_transport) == 0)) {
	    attrs = (*trans_list)->listen(cm, &CMstatic_trans_svcs,
					  *trans_list,
					  listen_info);
	    add_attr(attrs, CM_CMANAGER_ID, Attr_Int4, (intptr_t)cm->CManager_ID);
	    if (iface) {
		add_string_attr(attrs, CM_IP_INTERFACE, strdup(iface));
	    }
	    add_contact_list(cm, attrs);
	    if (CMtrace_on(cm, CMConnectionVerbose)) {
		fprintf(cm->CMTrace_file, "Adding contact list -> ");
		fdump_attr_list(cm->CMTrace_file, attrs);
	    }
	    if (attrs != NULL) {
		success++;
	    }
	}
	trans_list++;
    }
    if (listen_info) free_attr_list(listen_info);
    return success;
}